

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmPFlush<(moira::Instr)179,(moira::Mode)10,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  u32 uVar3;
  StrWriter *pSVar4;
  Imu<4> im;
  undefined1 local_44 [20];
  
  uVar1 = *addr;
  uVar3 = dasmIncRead<2>(this,addr);
  SVar2 = str->style->syntax;
  im.raw = (uint)(MOIRA_MIT < SVar2) * 8 + 7 & uVar3 >> 5;
  if ((SVar2 & ~MOIRA_MIT) != GNU) {
    pSVar4 = StrWriter::operator<<(str);
    StrWriter::operator<<(pSVar4,(Tab)(str->tab).raw);
    StrWriter::operator<<(str,(Fc)(uVar3 & 0x1f));
    StrWriter::operator<<(str);
    StrWriter::operator<<(str,im);
    if ((uVar3 & 0x1c00) == 0x1800) {
      StrWriter::operator<<(str);
      Op<(moira::Mode)10,2>((Ea<(moira::Mode)10,_2> *)local_44,this,op & 7,addr);
      StrWriter::operator<<(str,(Ea<(moira::Mode)10,_2> *)local_44);
    }
    return;
  }
  if (((uVar3 & 0x1c00) == 0x1000) && ((uVar3 & 0x1e) - 8 < 0xfffffffa)) {
    pSVar4 = StrWriter::operator<<(str);
    StrWriter::operator<<(pSVar4,(Tab)(str->tab).raw);
    StrWriter::operator<<(str,(Fc)(uVar3 & 0x1f));
    StrWriter::operator<<(str);
    StrWriter::operator<<(str,im);
    return;
  }
  *addr = uVar1;
  dasmIllegal<(moira::Instr)179,(moira::Mode)10,4>(this,str,addr,op);
  return;
}

Assistant:

void
Moira::dasmPFlush(StrWriter &str, u32 &addr, u16 op) const
{
    auto old  = addr;
    auto ext  = dasmIncRead<Word>(addr);
    auto reg  = _____________xxx (op);
    auto mode = ___xxx__________ (ext);
    auto mask = _______xxxx_____ (ext);
    auto fc   = ___________xxxxx (ext);

    // Only the MC68851 has four mask bits. The 68030 only has three.
    if (str.style.syntax == Syntax::MOIRA || str.style.syntax == Syntax::MOIRA_MIT) mask &= 0b111;

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << str.tab;
    str << Fc{fc} << Sep{} << Imu{mask};
    if (mode == 0b110) str << Sep{} << Op<M>(reg, addr);
}